

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::addMeshPoint
          (MultipleShootingTranscription *this,MeshPoint *newMeshPoint)

{
  anon_struct_112_6_78b70dfe *paVar1;
  
  paVar1 = (this->m_meshPointsEnd)._M_current;
  if (paVar1 == (this->m_meshPoints).
                super__Vector_base<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
    ::push_back(&this->m_meshPoints,newMeshPoint);
    paVar1 = (this->m_meshPoints).
             super__Vector_base<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    anon_struct_112_6_78b70dfe::operator=(paVar1,newMeshPoint);
    paVar1 = (this->m_meshPointsEnd)._M_current + 1;
  }
  (this->m_meshPointsEnd)._M_current = paVar1;
  return;
}

Assistant:

void addMeshPoint(MeshPoint& newMeshPoint){
                if (m_meshPointsEnd == m_meshPoints.end()){
                    m_meshPoints.push_back(newMeshPoint);
                    m_meshPointsEnd = m_meshPoints.end();
                } else {
                    *m_meshPointsEnd = newMeshPoint;
                    ++m_meshPointsEnd;
                }
            }